

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

bool __thiscall inja::Parser::parse_expression_comparison(Parser *this,Template *tmpl)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  size_t local_38;
  char *local_30;
  Op local_21;
  Template *pTStack_20;
  Op op;
  Template *tmpl_local;
  Parser *this_local;
  
  pTStack_20 = tmpl;
  tmpl_local = (Template *)this;
  bVar1 = parse_expression_datum(this,tmpl);
  if (bVar1) {
    switch((this->m_tok).kind) {
    case Id:
      local_38 = (this->m_tok).text._M_len;
      local_30 = (this->m_tok).text._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"in");
      __x._M_str = local_30;
      __x._M_len = local_38;
      bVar1 = std::operator==(__x,local_48);
      if (!bVar1) {
        return true;
      }
      local_21 = In;
      break;
    default:
      return true;
    case Equal:
      local_21 = Equal;
      break;
    case GreaterThan:
      local_21 = Greater;
      break;
    case GreaterEqual:
      local_21 = GreaterEqual;
      break;
    case LessThan:
      local_21 = Less;
      break;
    case LessEqual:
      local_21 = LessEqual;
      break;
    case NotEqual:
      local_21 = Different;
    }
    get_next_token(this);
    bVar1 = parse_expression_datum(this,pTStack_20);
    if (bVar1) {
      append_function(this,pTStack_20,local_21,2);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool parse_expression_comparison(Template& tmpl) {
    if (!parse_expression_datum(tmpl)) return false;
    Bytecode::Op op;
    switch (m_tok.kind) {
      case Token::Kind::Id:
        if (m_tok.text == static_cast<decltype(m_tok.text)>("in"))
          op = Bytecode::Op::In;
        else
          return true;
        break;
      case Token::Kind::Equal:
        op = Bytecode::Op::Equal;
        break;
      case Token::Kind::GreaterThan:
        op = Bytecode::Op::Greater;
        break;
      case Token::Kind::LessThan:
        op = Bytecode::Op::Less;
        break;
      case Token::Kind::LessEqual:
        op = Bytecode::Op::LessEqual;
        break;
      case Token::Kind::GreaterEqual:
        op = Bytecode::Op::GreaterEqual;
        break;
      case Token::Kind::NotEqual:
        op = Bytecode::Op::Different;
        break;
      default:
        return true;
    }
    get_next_token();
    if (!parse_expression_datum(tmpl)) return false;
    append_function(tmpl, op, 2);
    return true;
  }